

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O1

void Ssw_SmlAssignDist1Plus(Ssw_Sml_t *p,uint *pPat)

{
  uint *puVar1;
  Vec_Ptr_t *pVVar2;
  Aig_Man_t *pAVar3;
  uint uVar4;
  int iFrame;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  
  if (p->nFrames < 1) {
    __assert_fail("p->nFrames > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswSim.c"
                  ,0x2a6,"void Ssw_SmlAssignDist1Plus(Ssw_Sml_t *, unsigned int *)");
  }
  pAVar3 = p->pAig;
  pVVar2 = pAVar3->vCis;
  if (0 < pVVar2->nSize) {
    uVar6 = 0;
    do {
      Ssw_SmlObjAssignConst
                (p,(Aig_Obj_t *)pVVar2->pArray[uVar6],
                 (uint)((pPat[uVar6 >> 5 & 0x7ffffff] >> ((uint)uVar6 & 0x1f) & 1) != 0),0);
      uVar6 = uVar6 + 1;
      pAVar3 = p->pAig;
      pVVar2 = pAVar3->vCis;
    } while ((long)uVar6 < (long)pVVar2->nSize);
  }
  uVar4 = p->nWordsFrame * 0x20 - 1;
  if (pAVar3->nTruePis < (int)uVar4) {
    uVar4 = pAVar3->nTruePis;
  }
  if (0 < (int)uVar4) {
    uVar6 = 1;
    do {
      if ((long)pVVar2->nSize <= (long)(uVar6 - 1)) {
LAB_005efaca:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar1 = (uint *)((long)&p[1].pAig +
                       (uVar6 >> 5 & 0x7ffffff) * 4 +
                       (long)p->nWordsTotal * (long)*(int *)((long)pVVar2->pArray[uVar6 - 1] + 0x24)
                       * 4);
      *puVar1 = *puVar1 ^ 1 << ((byte)uVar6 & 0x1f);
      bVar7 = uVar6 != uVar4;
      uVar6 = uVar6 + 1;
    } while (bVar7);
  }
  if (1 < p->nFrames) {
    iFrame = 1;
    do {
      pAVar3 = p->pAig;
      if (0 < pAVar3->nTruePis) {
        lVar5 = 0;
        do {
          if (pAVar3->vCis->nSize <= lVar5) goto LAB_005efaca;
          Ssw_SmlAssignRandomFrame(p,(Aig_Obj_t *)pAVar3->vCis->pArray[lVar5],iFrame);
          lVar5 = lVar5 + 1;
          pAVar3 = p->pAig;
        } while (lVar5 < pAVar3->nTruePis);
      }
      iFrame = iFrame + 1;
    } while (iFrame < p->nFrames);
  }
  return;
}

Assistant:

void Ssw_SmlAssignDist1Plus( Ssw_Sml_t * p, unsigned * pPat )
{
    Aig_Obj_t * pObj;
    int f, i, Limit;
    assert( p->nFrames > 0 );

    // copy the pattern into the primary inputs
    Aig_ManForEachCi( p->pAig, pObj, i )
        Ssw_SmlObjAssignConst( p, pObj, Abc_InfoHasBit(pPat, i), 0 );

    // set distance one PIs for the first frame
    Limit = Abc_MinInt( Saig_ManPiNum(p->pAig), p->nWordsFrame * 32 - 1 );
    for ( i = 0; i < Limit; i++ )
        Abc_InfoXorBit( Ssw_ObjSim( p, Aig_ManCi(p->pAig, i)->Id ), i+1 );

    // create random info for the remaining timeframes
    for ( f = 1; f < p->nFrames; f++ )
        Saig_ManForEachPi( p->pAig, pObj, i )
            Ssw_SmlAssignRandomFrame( p, pObj, f );
}